

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

DateTimeMatcher * __thiscall icu_63::PatternMapIterator::next(PatternMapIterator *this)

{
  bool bVar1;
  PtnElem *pPVar2;
  DateTimeMatcher *pDVar3;
  PtnSkeleton *newSkeleton;
  PatternMapIterator *this_local;
  
LAB_003ac2b4:
  do {
    if (0x33 < this->bootIndex) {
LAB_003ac360:
      if (this->nodePtr == (PtnElem *)0x0) {
        pDVar3 = LocalPointerBase<icu_63::DateTimeMatcher>::operator->
                           (&(this->matcher).super_LocalPointerBase<icu_63::DateTimeMatcher>);
        DateTimeMatcher::copyFrom(pDVar3);
      }
      else {
        pDVar3 = LocalPointerBase<icu_63::DateTimeMatcher>::operator->
                           (&(this->matcher).super_LocalPointerBase<icu_63::DateTimeMatcher>);
        newSkeleton = LocalPointerBase<icu_63::PtnSkeleton>::operator*
                                (&(this->nodePtr->skeleton).
                                  super_LocalPointerBase<icu_63::PtnSkeleton>);
        DateTimeMatcher::copyFrom(pDVar3,newSkeleton);
      }
      pDVar3 = LocalPointerBase<icu_63::DateTimeMatcher>::operator*
                         (&(this->matcher).super_LocalPointerBase<icu_63::DateTimeMatcher>);
      return pDVar3;
    }
    if (this->nodePtr != (PtnElem *)0x0) {
      bVar1 = LocalPointerBase<icu_63::PtnElem>::operator!=
                        (&(this->nodePtr->next).super_LocalPointerBase<icu_63::PtnElem>,
                         (PtnElem *)0x0);
      if (bVar1) {
        pPVar2 = LocalPointerBase<icu_63::PtnElem>::getAlias
                           (&(this->nodePtr->next).super_LocalPointerBase<icu_63::PtnElem>);
        this->nodePtr = pPVar2;
        goto LAB_003ac360;
      }
      this->bootIndex = this->bootIndex + 1;
      this->nodePtr = (PtnElem *)0x0;
      goto LAB_003ac2b4;
    }
    if (this->patternMap->boot[this->bootIndex] != (PtnElem *)0x0) {
      this->nodePtr = this->patternMap->boot[this->bootIndex];
      goto LAB_003ac360;
    }
    this->bootIndex = this->bootIndex + 1;
  } while( true );
}

Assistant:

DateTimeMatcher&
PatternMapIterator::next() {
    while ( bootIndex < MAX_PATTERN_ENTRIES ) {
        if ( nodePtr != nullptr ) {
            if ( nodePtr->next != nullptr ) {
                nodePtr = nodePtr->next.getAlias();
                break;
            }
            else {
                bootIndex++;
                nodePtr=nullptr;
                continue;
            }
        }
        else {
            if ( patternMap->boot[bootIndex] != nullptr ) {
                nodePtr = patternMap->boot[bootIndex];
                break;
            }
            else {
                bootIndex++;
                continue;
            }
        }
    }
    if (nodePtr!=nullptr) {
        matcher->copyFrom(*nodePtr->skeleton);
    }
    else {
        matcher->copyFrom();
    }
    return *matcher;
}